

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O1

void __thiscall wabt::GlobalImport::~GlobalImport(GlobalImport *this)

{
  Expr *pEVar1;
  pointer pcVar2;
  _func_int ***ppp_Var3;
  
  (this->super_ImportMixin<(wabt::ExternalKind)3>).super_Import._vptr_Import =
       (_func_int **)&PTR__GlobalImport_00186b10;
  pEVar1 = (this->global).init_expr.first_;
  while (pEVar1 != (Expr *)0x0) {
    ppp_Var3 = &pEVar1->_vptr_Expr;
    pEVar1 = (pEVar1->super_intrusive_list_base<wabt::Expr>).next_;
    (*(*ppp_Var3)[1])();
  }
  (this->global).init_expr.first_ = (Expr *)0x0;
  (this->global).init_expr.last_ = (Expr *)0x0;
  (this->global).init_expr.size_ = 0;
  pcVar2 = (this->global).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->global).name.field_2) {
    operator_delete(pcVar2);
  }
  Import::~Import((Import *)this);
  operator_delete(this);
  return;
}

Assistant:

explicit GlobalImport(string_view name = string_view())
      : ImportMixin<ExternalKind::Global>(), global(name) {}